

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

optional<unsigned_long> find_in_table(token *token,char **table,string_view prefix)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar4;
  optional<unsigned_long> oVar5;
  unsigned_long local_78;
  unsigned_long local_70;
  size_t i;
  char *local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  undefined1 local_48 [8];
  string_view text;
  char **table_local;
  token *token_local;
  string_view prefix_local;
  undefined1 local_10;
  
  prefix_local._M_len = (size_t)prefix._M_str;
  token_local = (token *)prefix._M_len;
  text._M_str = (char *)table;
  if (token->type == identifier) {
    local_48 = *(undefined1 (*) [8])&(token->data).predicate;
    text._M_len = (size_t)(token->data).string._M_str;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&token_local);
    if (!bVar1) {
      sVar3 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string_view<char,_std::char_traits<char>_> *)&token_local);
      local_58 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_48,0,sVar3);
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&token_local,local_58);
      if (iVar2 != 0) {
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)&prefix_local._M_str);
        uVar4 = extraout_RDX_00;
        goto LAB_00145c0b;
      }
      sVar3 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string_view<char,_std::char_traits<char>_> *)&token_local);
      _i = std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_48,sVar3,
                      0xffffffffffffffff);
      local_48 = (undefined1  [8])i;
      text._M_len = (size_t)local_60;
    }
    for (local_70 = 0; *(long *)(text._M_str + local_70 * 8) != 0; local_70 = local_70 + 1) {
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_48,
                         *(char **)(text._M_str + local_70 * 8));
      if (iVar2 == 0) {
        local_78 = local_70;
        std::optional<unsigned_long>::optional<unsigned_long,_true>
                  ((optional<unsigned_long> *)&prefix_local._M_str,&local_78);
        uVar4 = extraout_RDX_01;
        goto LAB_00145c0b;
      }
    }
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&prefix_local._M_str);
    uVar4 = extraout_RDX_02;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&prefix_local._M_str);
    uVar4 = extraout_RDX;
  }
LAB_00145c0b:
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_10;
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)prefix_local._M_str;
  return (optional<unsigned_long>)
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> find_in_table(const token& token, const char* const* table,
                                      std::string_view prefix)
{
    if (token.type != token_type::identifier) {
        return {};
    }

    std::string_view text = token.data.string;

    if (!prefix.empty()) {
        if (prefix.compare(text.substr(0, std::size(prefix))) != 0) {
            return {};
        }
        text = text.substr(std::size(prefix));
    }

    for (size_t i = 0; table[i]; ++i) {
        if (text.compare(table[i]) != 0) {
            continue;
        }
        return static_cast<uint64_t>(i);
    }
    return {};
}